

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O3

void __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>,_std::tuple<slang::DiagCode,_slang::SourceLocation>,_slang::Hasher<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_ska::detailv3::KeyOrValueHasher<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>,_slang::Hasher<std::tuple<slang::DiagCode,_slang::SourceLocation>_>_>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_ska::detailv3::KeyOrValueEquality<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>_>,_std::allocator<std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>_>_>_>
::rehash(sherwood_v3_table<std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>,_std::tuple<slang::DiagCode,_slang::SourceLocation>,_slang::Hasher<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_ska::detailv3::KeyOrValueHasher<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>,_slang::Hasher<std::tuple<slang::DiagCode,_slang::SourceLocation>_>_>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_ska::detailv3::KeyOrValueEquality<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>_>,_std::allocator<std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>_>_>_>
         *this,size_t num_buckets)

{
  char max_lookups;
  EntryPointer begin;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  int8_t iVar31;
  size_t sVar32;
  ulong uVar33;
  sherwood_v3_entry<std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>_>
  *psVar34;
  ulong uVar35;
  EntryPointer it;
  sherwood_v3_entry<std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>_>
  *psVar36;
  byte bVar37;
  vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_> *this_00;
  long lVar38;
  undefined4 uVar39;
  double dVar40;
  undefined4 uVar42;
  undefined1 auVar41 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  int iVar63;
  int iVar66;
  int iVar67;
  undefined1 auVar64 [16];
  int iVar68;
  undefined1 auVar65 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  int iVar82;
  int iVar86;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  ulong local_38;
  
  auVar43._0_8_ = (double)CONCAT44(0x43300000,(int)this->num_elements);
  auVar43._8_4_ = (int)(this->num_elements >> 0x20);
  auVar43._12_4_ = 0x45300000;
  auVar44._0_8_ = (double)this->_max_load_factor;
  auVar44._8_8_ = 0;
  dVar40 = ceil(((auVar43._8_8_ - 1.9342813113834067e+25) + (auVar43._0_8_ - 4503599627370496.0)) /
                auVar44._0_8_);
  local_38 = (long)(dVar40 - 9.223372036854776e+18) & (long)dVar40 >> 0x3f | (long)dVar40;
  if (local_38 <= num_buckets) {
    local_38 = num_buckets;
  }
  if (local_38 == 0) {
    reset_to_empty_state(this);
    return;
  }
  iVar31 = fibonacci_hash_policy::next_size_over(&this->hash_policy,&local_38);
  sVar32 = this->num_slots_minus_one;
  if (sVar32 != 0) {
    sVar32 = sVar32 + 1;
  }
  if (local_38 != sVar32) {
    uVar33 = local_38 >> 1 | local_38;
    uVar33 = uVar33 >> 2 | uVar33;
    uVar33 = uVar33 >> 4 | uVar33;
    uVar33 = uVar33 >> 8 | uVar33;
    uVar33 = uVar33 >> 0x10 | uVar33;
    uVar33 = uVar33 >> 0x20 | uVar33;
    bVar37 = 4;
    if ('\x04' < (char)log2(unsigned_long)::table
                       [(uVar33 - (uVar33 >> 1)) * 0x7edd5e59a4e28c2 >> 0x3a]) {
      bVar37 = log2(unsigned_long)::table[(uVar33 - (uVar33 >> 1)) * 0x7edd5e59a4e28c2 >> 0x3a];
    }
    psVar34 = __gnu_cxx::
              new_allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>_>_>
              ::allocate((new_allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>_>_>
                          *)this,local_38 + bVar37,(void *)0x0);
    auVar30 = _DAT_003e7450;
    auVar29 = _DAT_003e7440;
    auVar28 = _DAT_003e7430;
    auVar27 = _DAT_003e7420;
    auVar26 = _DAT_003e7410;
    auVar25 = _DAT_003e7400;
    auVar43 = _DAT_003e64d0;
    if (psVar34 !=
        (sherwood_v3_entry<std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>_>
         *)(&psVar34[local_38 - 1].distance_from_desired + (uint)bVar37 * 0x30)) {
      uVar33 = (bVar37 + local_38) * 0x30 - 0x60;
      auVar64._8_8_ = 0;
      auVar64._0_8_ = uVar33;
      uVar39 = SUB164(auVar64 * ZEXT816(0xaaaaaaaaaaaaaaab),8);
      uVar42 = (undefined4)(uVar33 / 0x180000000);
      auVar69._0_8_ = CONCAT44(uVar42,uVar39);
      auVar69._8_4_ = uVar39;
      auVar69._12_4_ = uVar42;
      auVar41._0_8_ = auVar69._0_8_ >> 5;
      auVar41._8_8_ = auVar69._8_8_ >> 5;
      uVar35 = 0;
      psVar36 = psVar34;
      do {
        auVar61._8_4_ = (int)uVar35;
        auVar61._0_8_ = uVar35;
        auVar61._12_4_ = (int)(uVar35 >> 0x20);
        auVar64 = auVar41 ^ auVar43;
        auVar69 = (auVar61 | auVar30) ^ auVar43;
        iVar63 = auVar64._0_4_;
        iVar82 = -(uint)(iVar63 < auVar69._0_4_);
        iVar66 = auVar64._4_4_;
        auVar71._4_4_ = -(uint)(iVar66 < auVar69._4_4_);
        iVar67 = auVar64._8_4_;
        iVar86 = -(uint)(iVar67 < auVar69._8_4_);
        iVar68 = auVar64._12_4_;
        auVar71._12_4_ = -(uint)(iVar68 < auVar69._12_4_);
        auVar11._4_4_ = iVar82;
        auVar11._0_4_ = iVar82;
        auVar11._8_4_ = iVar86;
        auVar11._12_4_ = iVar86;
        auVar44 = pshuflw(auVar44,auVar11,0xe8);
        auVar70._4_4_ = -(uint)(auVar69._4_4_ == iVar66);
        auVar70._12_4_ = -(uint)(auVar69._12_4_ == iVar68);
        auVar70._0_4_ = auVar70._4_4_;
        auVar70._8_4_ = auVar70._12_4_;
        auVar69 = pshuflw(in_XMM2,auVar70,0xe8);
        auVar71._0_4_ = auVar71._4_4_;
        auVar71._8_4_ = auVar71._12_4_;
        auVar64 = pshuflw(auVar44,auVar71,0xe8);
        auVar45._8_4_ = 0xffffffff;
        auVar45._0_8_ = 0xffffffffffffffff;
        auVar45._12_4_ = 0xffffffff;
        auVar45 = (auVar64 | auVar69 & auVar44) ^ auVar45;
        auVar44 = packssdw(auVar45,auVar45);
        if ((auVar44 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          psVar36->distance_from_desired = -1;
        }
        auVar12._4_4_ = iVar82;
        auVar12._0_4_ = iVar82;
        auVar12._8_4_ = iVar86;
        auVar12._12_4_ = iVar86;
        auVar71 = auVar70 & auVar12 | auVar71;
        auVar44 = packssdw(auVar71,auVar71);
        auVar1._8_4_ = 0xffffffff;
        auVar1._0_8_ = 0xffffffffffffffff;
        auVar1._12_4_ = 0xffffffff;
        auVar44 = packssdw(auVar44 ^ auVar1,auVar44 ^ auVar1);
        auVar44 = packsswb(auVar44,auVar44);
        if ((auVar44._0_4_ >> 8 & 1) != 0) {
          psVar36[1].distance_from_desired = -1;
        }
        auVar44 = (auVar61 | auVar29) ^ auVar43;
        auVar54._0_4_ = -(uint)(iVar63 < auVar44._0_4_);
        auVar54._4_4_ = -(uint)(iVar66 < auVar44._4_4_);
        auVar54._8_4_ = -(uint)(iVar67 < auVar44._8_4_);
        auVar54._12_4_ = -(uint)(iVar68 < auVar44._12_4_);
        auVar72._4_4_ = auVar54._0_4_;
        auVar72._0_4_ = auVar54._0_4_;
        auVar72._8_4_ = auVar54._8_4_;
        auVar72._12_4_ = auVar54._8_4_;
        iVar82 = -(uint)(auVar44._4_4_ == iVar66);
        iVar86 = -(uint)(auVar44._12_4_ == iVar68);
        auVar13._4_4_ = iVar82;
        auVar13._0_4_ = iVar82;
        auVar13._8_4_ = iVar86;
        auVar13._12_4_ = iVar86;
        auVar83._4_4_ = auVar54._4_4_;
        auVar83._0_4_ = auVar54._4_4_;
        auVar83._8_4_ = auVar54._12_4_;
        auVar83._12_4_ = auVar54._12_4_;
        auVar44 = auVar13 & auVar72 | auVar83;
        auVar44 = packssdw(auVar44,auVar44);
        auVar2._8_4_ = 0xffffffff;
        auVar2._0_8_ = 0xffffffffffffffff;
        auVar2._12_4_ = 0xffffffff;
        auVar44 = packssdw(auVar44 ^ auVar2,auVar44 ^ auVar2);
        auVar44 = packsswb(auVar44,auVar44);
        if ((auVar44._0_4_ >> 0x10 & 1) != 0) {
          psVar36[2].distance_from_desired = -1;
        }
        auVar44 = pshufhw(auVar44,auVar72,0x84);
        auVar14._4_4_ = iVar82;
        auVar14._0_4_ = iVar82;
        auVar14._8_4_ = iVar86;
        auVar14._12_4_ = iVar86;
        auVar69 = pshufhw(auVar54,auVar14,0x84);
        auVar64 = pshufhw(auVar44,auVar83,0x84);
        auVar46._8_4_ = 0xffffffff;
        auVar46._0_8_ = 0xffffffffffffffff;
        auVar46._12_4_ = 0xffffffff;
        auVar46 = (auVar64 | auVar69 & auVar44) ^ auVar46;
        auVar44 = packssdw(auVar46,auVar46);
        auVar44 = packsswb(auVar44,auVar44);
        if ((auVar44._0_4_ >> 0x18 & 1) != 0) {
          psVar36[3].distance_from_desired = -1;
        }
        auVar44 = (auVar61 | auVar28) ^ auVar43;
        auVar55._0_4_ = -(uint)(iVar63 < auVar44._0_4_);
        auVar55._4_4_ = -(uint)(iVar66 < auVar44._4_4_);
        auVar55._8_4_ = -(uint)(iVar67 < auVar44._8_4_);
        auVar55._12_4_ = -(uint)(iVar68 < auVar44._12_4_);
        auVar15._4_4_ = auVar55._0_4_;
        auVar15._0_4_ = auVar55._0_4_;
        auVar15._8_4_ = auVar55._8_4_;
        auVar15._12_4_ = auVar55._8_4_;
        auVar69 = pshuflw(auVar83,auVar15,0xe8);
        auVar47._0_4_ = -(uint)(auVar44._0_4_ == iVar63);
        auVar47._4_4_ = -(uint)(auVar44._4_4_ == iVar66);
        auVar47._8_4_ = -(uint)(auVar44._8_4_ == iVar67);
        auVar47._12_4_ = -(uint)(auVar44._12_4_ == iVar68);
        auVar73._4_4_ = auVar47._4_4_;
        auVar73._0_4_ = auVar47._4_4_;
        auVar73._8_4_ = auVar47._12_4_;
        auVar73._12_4_ = auVar47._12_4_;
        auVar44 = pshuflw(auVar47,auVar73,0xe8);
        auVar74._4_4_ = auVar55._4_4_;
        auVar74._0_4_ = auVar55._4_4_;
        auVar74._8_4_ = auVar55._12_4_;
        auVar74._12_4_ = auVar55._12_4_;
        auVar64 = pshuflw(auVar55,auVar74,0xe8);
        auVar3._8_4_ = 0xffffffff;
        auVar3._0_8_ = 0xffffffffffffffff;
        auVar3._12_4_ = 0xffffffff;
        auVar44 = packssdw(auVar44 & auVar69,(auVar64 | auVar44 & auVar69) ^ auVar3);
        auVar44 = packsswb(auVar44,auVar44);
        if ((auVar44 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          psVar36[4].distance_from_desired = -1;
        }
        auVar16._4_4_ = auVar55._0_4_;
        auVar16._0_4_ = auVar55._0_4_;
        auVar16._8_4_ = auVar55._8_4_;
        auVar16._12_4_ = auVar55._8_4_;
        auVar74 = auVar73 & auVar16 | auVar74;
        auVar64 = packssdw(auVar74,auVar74);
        auVar4._8_4_ = 0xffffffff;
        auVar4._0_8_ = 0xffffffffffffffff;
        auVar4._12_4_ = 0xffffffff;
        auVar44 = packssdw(auVar44,auVar64 ^ auVar4);
        auVar44 = packsswb(auVar44,auVar44);
        if ((auVar44._4_2_ >> 8 & 1) != 0) {
          psVar36[5].distance_from_desired = -1;
        }
        auVar44 = (auVar61 | auVar27) ^ auVar43;
        auVar56._0_4_ = -(uint)(iVar63 < auVar44._0_4_);
        auVar56._4_4_ = -(uint)(iVar66 < auVar44._4_4_);
        auVar56._8_4_ = -(uint)(iVar67 < auVar44._8_4_);
        auVar56._12_4_ = -(uint)(iVar68 < auVar44._12_4_);
        auVar75._4_4_ = auVar56._0_4_;
        auVar75._0_4_ = auVar56._0_4_;
        auVar75._8_4_ = auVar56._8_4_;
        auVar75._12_4_ = auVar56._8_4_;
        iVar82 = -(uint)(auVar44._4_4_ == iVar66);
        iVar86 = -(uint)(auVar44._12_4_ == iVar68);
        auVar17._4_4_ = iVar82;
        auVar17._0_4_ = iVar82;
        auVar17._8_4_ = iVar86;
        auVar17._12_4_ = iVar86;
        auVar84._4_4_ = auVar56._4_4_;
        auVar84._0_4_ = auVar56._4_4_;
        auVar84._8_4_ = auVar56._12_4_;
        auVar84._12_4_ = auVar56._12_4_;
        auVar44 = auVar17 & auVar75 | auVar84;
        auVar44 = packssdw(auVar44,auVar44);
        auVar5._8_4_ = 0xffffffff;
        auVar5._0_8_ = 0xffffffffffffffff;
        auVar5._12_4_ = 0xffffffff;
        auVar44 = packssdw(auVar44 ^ auVar5,auVar44 ^ auVar5);
        auVar44 = packsswb(auVar44,auVar44);
        if ((auVar44 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          psVar36[6].distance_from_desired = -1;
        }
        auVar44 = pshufhw(auVar44,auVar75,0x84);
        auVar18._4_4_ = iVar82;
        auVar18._0_4_ = iVar82;
        auVar18._8_4_ = iVar86;
        auVar18._12_4_ = iVar86;
        auVar69 = pshufhw(auVar56,auVar18,0x84);
        auVar64 = pshufhw(auVar44,auVar84,0x84);
        auVar48._8_4_ = 0xffffffff;
        auVar48._0_8_ = 0xffffffffffffffff;
        auVar48._12_4_ = 0xffffffff;
        auVar48 = (auVar64 | auVar69 & auVar44) ^ auVar48;
        auVar44 = packssdw(auVar48,auVar48);
        auVar44 = packsswb(auVar44,auVar44);
        if ((auVar44._6_2_ >> 8 & 1) != 0) {
          psVar36[7].distance_from_desired = -1;
        }
        auVar44 = (auVar61 | auVar26) ^ auVar43;
        auVar57._0_4_ = -(uint)(iVar63 < auVar44._0_4_);
        auVar57._4_4_ = -(uint)(iVar66 < auVar44._4_4_);
        auVar57._8_4_ = -(uint)(iVar67 < auVar44._8_4_);
        auVar57._12_4_ = -(uint)(iVar68 < auVar44._12_4_);
        auVar19._4_4_ = auVar57._0_4_;
        auVar19._0_4_ = auVar57._0_4_;
        auVar19._8_4_ = auVar57._8_4_;
        auVar19._12_4_ = auVar57._8_4_;
        auVar69 = pshuflw(auVar84,auVar19,0xe8);
        auVar49._0_4_ = -(uint)(auVar44._0_4_ == iVar63);
        auVar49._4_4_ = -(uint)(auVar44._4_4_ == iVar66);
        auVar49._8_4_ = -(uint)(auVar44._8_4_ == iVar67);
        auVar49._12_4_ = -(uint)(auVar44._12_4_ == iVar68);
        auVar76._4_4_ = auVar49._4_4_;
        auVar76._0_4_ = auVar49._4_4_;
        auVar76._8_4_ = auVar49._12_4_;
        auVar76._12_4_ = auVar49._12_4_;
        auVar44 = pshuflw(auVar49,auVar76,0xe8);
        auVar77._4_4_ = auVar57._4_4_;
        auVar77._0_4_ = auVar57._4_4_;
        auVar77._8_4_ = auVar57._12_4_;
        auVar77._12_4_ = auVar57._12_4_;
        auVar64 = pshuflw(auVar57,auVar77,0xe8);
        auVar58._8_4_ = 0xffffffff;
        auVar58._0_8_ = 0xffffffffffffffff;
        auVar58._12_4_ = 0xffffffff;
        auVar58 = (auVar64 | auVar44 & auVar69) ^ auVar58;
        auVar64 = packssdw(auVar58,auVar58);
        auVar44 = packsswb(auVar44 & auVar69,auVar64);
        if ((auVar44 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          psVar36[8].distance_from_desired = -1;
        }
        auVar20._4_4_ = auVar57._0_4_;
        auVar20._0_4_ = auVar57._0_4_;
        auVar20._8_4_ = auVar57._8_4_;
        auVar20._12_4_ = auVar57._8_4_;
        auVar77 = auVar76 & auVar20 | auVar77;
        auVar64 = packssdw(auVar77,auVar77);
        auVar6._8_4_ = 0xffffffff;
        auVar6._0_8_ = 0xffffffffffffffff;
        auVar6._12_4_ = 0xffffffff;
        auVar64 = packssdw(auVar64 ^ auVar6,auVar64 ^ auVar6);
        auVar44 = packsswb(auVar44,auVar64);
        if ((auVar44._8_2_ >> 8 & 1) != 0) {
          psVar36[9].distance_from_desired = -1;
        }
        auVar44 = (auVar61 | auVar25) ^ auVar43;
        auVar59._0_4_ = -(uint)(iVar63 < auVar44._0_4_);
        auVar59._4_4_ = -(uint)(iVar66 < auVar44._4_4_);
        auVar59._8_4_ = -(uint)(iVar67 < auVar44._8_4_);
        auVar59._12_4_ = -(uint)(iVar68 < auVar44._12_4_);
        auVar78._4_4_ = auVar59._0_4_;
        auVar78._0_4_ = auVar59._0_4_;
        auVar78._8_4_ = auVar59._8_4_;
        auVar78._12_4_ = auVar59._8_4_;
        iVar82 = -(uint)(auVar44._4_4_ == iVar66);
        iVar86 = -(uint)(auVar44._12_4_ == iVar68);
        auVar21._4_4_ = iVar82;
        auVar21._0_4_ = iVar82;
        auVar21._8_4_ = iVar86;
        auVar21._12_4_ = iVar86;
        auVar85._4_4_ = auVar59._4_4_;
        auVar85._0_4_ = auVar59._4_4_;
        auVar85._8_4_ = auVar59._12_4_;
        auVar85._12_4_ = auVar59._12_4_;
        auVar44 = auVar21 & auVar78 | auVar85;
        auVar44 = packssdw(auVar44,auVar44);
        auVar7._8_4_ = 0xffffffff;
        auVar7._0_8_ = 0xffffffffffffffff;
        auVar7._12_4_ = 0xffffffff;
        auVar44 = packssdw(auVar44 ^ auVar7,auVar44 ^ auVar7);
        auVar44 = packsswb(auVar44,auVar44);
        if ((auVar44 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          psVar36[10].distance_from_desired = -1;
        }
        auVar44 = pshufhw(auVar44,auVar78,0x84);
        auVar22._4_4_ = iVar82;
        auVar22._0_4_ = iVar82;
        auVar22._8_4_ = iVar86;
        auVar22._12_4_ = iVar86;
        auVar69 = pshufhw(auVar59,auVar22,0x84);
        auVar64 = pshufhw(auVar44,auVar85,0x84);
        auVar50._8_4_ = 0xffffffff;
        auVar50._0_8_ = 0xffffffffffffffff;
        auVar50._12_4_ = 0xffffffff;
        auVar50 = (auVar64 | auVar69 & auVar44) ^ auVar50;
        auVar44 = packssdw(auVar50,auVar50);
        auVar44 = packsswb(auVar44,auVar44);
        if ((auVar44._10_2_ >> 8 & 1) != 0) {
          psVar36[0xb].distance_from_desired = -1;
        }
        auVar44 = (auVar61 | _DAT_003e73f0) ^ auVar43;
        auVar60._0_4_ = -(uint)(iVar63 < auVar44._0_4_);
        auVar60._4_4_ = -(uint)(iVar66 < auVar44._4_4_);
        auVar60._8_4_ = -(uint)(iVar67 < auVar44._8_4_);
        auVar60._12_4_ = -(uint)(iVar68 < auVar44._12_4_);
        auVar23._4_4_ = auVar60._0_4_;
        auVar23._0_4_ = auVar60._0_4_;
        auVar23._8_4_ = auVar60._8_4_;
        auVar23._12_4_ = auVar60._8_4_;
        auVar69 = pshuflw(auVar85,auVar23,0xe8);
        auVar51._0_4_ = -(uint)(auVar44._0_4_ == iVar63);
        auVar51._4_4_ = -(uint)(auVar44._4_4_ == iVar66);
        auVar51._8_4_ = -(uint)(auVar44._8_4_ == iVar67);
        auVar51._12_4_ = -(uint)(auVar44._12_4_ == iVar68);
        auVar79._4_4_ = auVar51._4_4_;
        auVar79._0_4_ = auVar51._4_4_;
        auVar79._8_4_ = auVar51._12_4_;
        auVar79._12_4_ = auVar51._12_4_;
        auVar44 = pshuflw(auVar51,auVar79,0xe8);
        auVar80._4_4_ = auVar60._4_4_;
        auVar80._0_4_ = auVar60._4_4_;
        auVar80._8_4_ = auVar60._12_4_;
        auVar80._12_4_ = auVar60._12_4_;
        auVar64 = pshuflw(auVar60,auVar80,0xe8);
        auVar8._8_4_ = 0xffffffff;
        auVar8._0_8_ = 0xffffffffffffffff;
        auVar8._12_4_ = 0xffffffff;
        auVar44 = packssdw(auVar44 & auVar69,(auVar64 | auVar44 & auVar69) ^ auVar8);
        auVar44 = packsswb(auVar44,auVar44);
        if ((auVar44 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          psVar36[0xc].distance_from_desired = -1;
        }
        auVar24._4_4_ = auVar60._0_4_;
        auVar24._0_4_ = auVar60._0_4_;
        auVar24._8_4_ = auVar60._8_4_;
        auVar24._12_4_ = auVar60._8_4_;
        auVar80 = auVar79 & auVar24 | auVar80;
        auVar64 = packssdw(auVar80,auVar80);
        auVar9._8_4_ = 0xffffffff;
        auVar9._0_8_ = 0xffffffffffffffff;
        auVar9._12_4_ = 0xffffffff;
        auVar44 = packssdw(auVar44,auVar64 ^ auVar9);
        auVar44 = packsswb(auVar44,auVar44);
        if ((auVar44._12_2_ >> 8 & 1) != 0) {
          psVar36[0xd].distance_from_desired = -1;
        }
        auVar44 = (auVar61 | _DAT_003e73e0) ^ auVar43;
        auVar52._0_4_ = -(uint)(iVar63 < auVar44._0_4_);
        auVar52._4_4_ = -(uint)(iVar66 < auVar44._4_4_);
        auVar52._8_4_ = -(uint)(iVar67 < auVar44._8_4_);
        auVar52._12_4_ = -(uint)(iVar68 < auVar44._12_4_);
        auVar81._4_4_ = auVar52._0_4_;
        auVar81._0_4_ = auVar52._0_4_;
        auVar81._8_4_ = auVar52._8_4_;
        auVar81._12_4_ = auVar52._8_4_;
        auVar62._4_4_ = -(uint)(auVar44._4_4_ == iVar66);
        auVar62._12_4_ = -(uint)(auVar44._12_4_ == iVar68);
        auVar62._0_4_ = auVar62._4_4_;
        auVar62._8_4_ = auVar62._12_4_;
        auVar65._4_4_ = auVar52._4_4_;
        auVar65._0_4_ = auVar52._4_4_;
        auVar65._8_4_ = auVar52._12_4_;
        auVar65._12_4_ = auVar52._12_4_;
        auVar64 = auVar62 & auVar81 | auVar65;
        auVar44 = packssdw(auVar52,auVar64);
        auVar10._8_4_ = 0xffffffff;
        auVar10._0_8_ = 0xffffffffffffffff;
        auVar10._12_4_ = 0xffffffff;
        auVar44 = packssdw(auVar44 ^ auVar10,auVar44 ^ auVar10);
        auVar44 = packsswb(auVar44,auVar44);
        if ((auVar44 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          psVar36[0xe].distance_from_desired = -1;
        }
        auVar44 = pshufhw(auVar44,auVar81,0x84);
        in_XMM2 = pshufhw(auVar64,auVar62,0x84);
        in_XMM2 = in_XMM2 & auVar44;
        auVar44 = pshufhw(auVar44,auVar65,0x84);
        auVar53._8_4_ = 0xffffffff;
        auVar53._0_8_ = 0xffffffffffffffff;
        auVar53._12_4_ = 0xffffffff;
        auVar53 = (auVar44 | in_XMM2) ^ auVar53;
        auVar44 = packssdw(auVar53,auVar53);
        auVar44 = packsswb(auVar44,auVar44);
        if ((auVar44._14_2_ >> 8 & 1) != 0) {
          psVar36[0xf].distance_from_desired = -1;
        }
        uVar35 = uVar35 + 0x10;
        psVar36 = psVar36 + 0x10;
      } while ((uVar33 / 0x30 + 0x10 & 0xfffffffffffffff0) != uVar35);
    }
    ((sherwood_v3_entry<std::pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>_>
      *)(&psVar34[local_38 - 1].distance_from_desired + (uint)bVar37 * 0x30))->distance_from_desired
         = '\0';
    begin = this->entries;
    sVar32 = this->num_slots_minus_one;
    this->entries = psVar34;
    this->num_slots_minus_one = local_38 - 1;
    (this->hash_policy).shift = iVar31;
    max_lookups = this->max_lookups;
    this->max_lookups = bVar37;
    this->num_elements = 0;
    local_38 = sVar32;
    if (begin != begin + sVar32 + (long)max_lookups) {
      this_00 = &(begin->field_1).value.second;
      lVar38 = sVar32 * 0x30 + (long)max_lookups * 0x30;
      do {
        if (-1 < *(char *)(this_00 + -1)) {
          sherwood_v3_table<std::pair<std::tuple<slang::DiagCode,slang::SourceLocation>,std::vector<slang::Diagnostic,std::allocator<slang::Diagnostic>>>,std::tuple<slang::DiagCode,slang::SourceLocation>,slang::Hasher<std::tuple<slang::DiagCode,slang::SourceLocation>>,ska::detailv3::KeyOrValueHasher<std::tuple<slang::DiagCode,slang::SourceLocation>,std::pair<std::tuple<slang::DiagCode,slang::SourceLocation>,std::vector<slang::Diagnostic,std::allocator<slang::Diagnostic>>>,slang::Hasher<std::tuple<slang::DiagCode,slang::SourceLocation>>>,std::equal_to<std::tuple<slang::DiagCode,slang::SourceLocation>>,ska::detailv3::KeyOrValueEquality<std::tuple<slang::DiagCode,slang::SourceLocation>,std::pair<std::tuple<slang::DiagCode,slang::SourceLocation>,std::vector<slang::Diagnostic,std::allocator<slang::Diagnostic>>>,std::equal_to<std::tuple<slang::DiagCode,slang::SourceLocation>>>,std::allocator<std::pair<std::tuple<slang::DiagCode,slang::SourceLocation>,std::vector<slang::Diagnostic,std::allocator<slang::Diagnostic>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<slang::DiagCode,slang::SourceLocation>,std::vector<slang::Diagnostic,std::allocator<slang::Diagnostic>>>>>>
          ::
          emplace<std::pair<std::tuple<slang::DiagCode,slang::SourceLocation>,std::vector<slang::Diagnostic,std::allocator<slang::Diagnostic>>>>
                    ((sherwood_v3_table<std::pair<std::tuple<slang::DiagCode,slang::SourceLocation>,std::vector<slang::Diagnostic,std::allocator<slang::Diagnostic>>>,std::tuple<slang::DiagCode,slang::SourceLocation>,slang::Hasher<std::tuple<slang::DiagCode,slang::SourceLocation>>,ska::detailv3::KeyOrValueHasher<std::tuple<slang::DiagCode,slang::SourceLocation>,std::pair<std::tuple<slang::DiagCode,slang::SourceLocation>,std::vector<slang::Diagnostic,std::allocator<slang::Diagnostic>>>,slang::Hasher<std::tuple<slang::DiagCode,slang::SourceLocation>>>,std::equal_to<std::tuple<slang::DiagCode,slang::SourceLocation>>,ska::detailv3::KeyOrValueEquality<std::tuple<slang::DiagCode,slang::SourceLocation>,std::pair<std::tuple<slang::DiagCode,slang::SourceLocation>,std::vector<slang::Diagnostic,std::allocator<slang::Diagnostic>>>,std::equal_to<std::tuple<slang::DiagCode,slang::SourceLocation>>>,std::allocator<std::pair<std::tuple<slang::DiagCode,slang::SourceLocation>,std::vector<slang::Diagnostic,std::allocator<slang::Diagnostic>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<slang::DiagCode,slang::SourceLocation>,std::vector<slang::Diagnostic,std::allocator<slang::Diagnostic>>>>>>
                      *)this,(pair<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>
                              *)((long)(this_00 + -1) + 8));
          std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>::~vector(this_00);
          *(undefined1 *)(this_00 + -1) = 0xff;
        }
        this_00 = this_00 + 2;
        lVar38 = lVar38 + -0x30;
      } while (lVar38 != 0);
    }
    deallocate_data(this,begin,local_38,max_lookups);
  }
  return;
}

Assistant:

void rehash(size_t num_buckets)
    {
        num_buckets = std::max(num_buckets, static_cast<size_t>(std::ceil(num_elements / static_cast<double>(_max_load_factor))));
        if (num_buckets == 0)
        {
            reset_to_empty_state();
            return;
        }
        auto new_prime_index = hash_policy.next_size_over(num_buckets);
        if (num_buckets == bucket_count())
            return;
        int8_t new_max_lookups = compute_max_lookups(num_buckets);
        EntryPointer new_buckets(AllocatorTraits::allocate(*this, num_buckets + new_max_lookups));
        EntryPointer special_end_item = new_buckets + static_cast<ptrdiff_t>(num_buckets + new_max_lookups - 1);
        for (EntryPointer it = new_buckets; it != special_end_item; ++it)
            it->distance_from_desired = -1;
        special_end_item->distance_from_desired = Entry::special_end_value;
        std::swap(entries, new_buckets);
        std::swap(num_slots_minus_one, num_buckets);
        --num_slots_minus_one;
        hash_policy.commit(new_prime_index);
        int8_t old_max_lookups = max_lookups;
        max_lookups = new_max_lookups;
        num_elements = 0;
        for (EntryPointer it = new_buckets, end = it + static_cast<ptrdiff_t>(num_buckets + old_max_lookups); it != end; ++it)
        {
            if (it->has_value())
            {
                emplace(std::move(it->value));
                it->destroy_value();
            }
        }
        deallocate_data(new_buckets, num_buckets, old_max_lookups);
    }